

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void EMIT_OP_RPTR_REG(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,
                     int multiplier,x86Reg base,uint shift,x86Reg reg2)

{
  x86Instruction *pxVar1;
  x86Argument arg_00;
  x86Argument arg_01;
  x86Reg xVar2;
  x86Reg xVar3;
  ulong uVar4;
  ulong uVar5;
  x86Argument arg;
  x86Reg local_8c;
  int local_88;
  x86Reg local_84;
  ulong local_80;
  int local_78;
  uint local_74;
  x86Argument local_70;
  x86Argument local_50;
  
  uVar5 = (ulong)reg2;
  local_8c = base;
  local_88 = multiplier;
  local_84 = index;
  CodeGenGenericContext::RedirectAddressComputation(ctx,&local_84,&local_88,&local_8c,&shift);
  xVar3 = local_84;
  xVar2 = local_8c;
  if (ctx->genReg[uVar5].type == argReg) {
    uVar5 = (ulong)ctx->genReg[uVar5].field_1.reg;
  }
  if (size == sDWORD) {
    if (ctx->genReg[uVar5].type == argNumber) {
      EMIT_OP_RPTR_NUM(ctx,op,sDWORD,local_84,local_88,local_8c,shift,
                       ctx->genReg[uVar5].field_1.labelID);
      return;
    }
  }
  ctx->genRegRead[local_8c] = true;
  ctx->genRegRead[local_84] = true;
  ctx->genRegRead[uVar5] = true;
  local_70.type = argPtr;
  local_70.ptrBase = local_8c;
  local_70.ptrIndex = local_84;
  local_70.ptrMult = local_88;
  local_70.ptrNum = shift;
  uVar4 = (ulong)(op - o_add);
  local_74 = shift;
  local_78 = local_88;
  local_70.field_1.ptrSize = size;
  if (op - o_add < 0x3d) {
    if ((0xe0c000000001c0fU >> (uVar4 & 0x3f) & 1) != 0) {
      local_80 = uVar5;
      CodeGenGenericContext::MemRead(ctx,&local_70);
      arg_00.ptrIndex = local_70.ptrIndex;
      arg_00.ptrBase = local_70.ptrBase;
      arg_00.ptrNum = local_70.ptrNum;
      arg_00.ptrMult = local_70.ptrMult;
      arg_00._4_4_ = local_70._4_4_;
      arg_00.type = local_70.type;
      arg_00.field_1.ptrSize = local_70.field_1.reg;
      arg_00.field_1.imm64Arg._4_4_ = local_70.field_1.imm64Arg._4_4_;
      CodeGenGenericContext::InvalidateAddressValue(ctx,arg_00);
      uVar5 = local_80;
      local_50.type = argNone;
      local_50.field_1.imm64Arg = 0;
      local_50.ptrBase = rNONE;
      local_50.ptrIndex = rNONE;
      local_50.ptrMult = 0;
      local_50.ptrNum = 0;
      CodeGenGenericContext::MemWrite(ctx,&local_70,&local_50);
      goto LAB_001d1d7b;
    }
    if ((0x1000000000002000U >> (uVar4 & 0x3f) & 1) != 0) {
      CodeGenGenericContext::MemRead(ctx,&local_70);
      goto LAB_001d1d7b;
    }
    if (uVar4 != 0x30) goto LAB_001d1dea;
  }
  else {
LAB_001d1dea:
    if (op != o_mov) {
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x71f,
                    "void EMIT_OP_RPTR_REG(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, x86Reg)"
                   );
    }
  }
  local_80 = (ulong)op;
  if (local_8c == rESP) {
    __assert_fail("base != rESP",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x6ff,
                  "void EMIT_OP_RPTR_REG(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, x86Reg)"
                 );
  }
  arg_01.ptrIndex = local_84;
  arg_01.ptrBase = local_8c;
  arg_01.ptrNum = shift;
  arg_01.ptrMult = local_88;
  arg_01._4_4_ = local_70._4_4_;
  arg_01.type = 4;
  arg_01.field_1.ptrSize = size;
  arg_01.field_1.imm64Arg._4_4_ = local_70.field_1.imm64Arg._4_4_;
  CodeGenGenericContext::InvalidateAddressValue(ctx,arg_01);
  CodeGenGenericContext::MemKillDeadStore(ctx,&local_70);
  local_50.type = argReg;
  local_50.field_1.reg = (int)uVar5;
  local_50.ptrBase = rNONE;
  local_50.ptrIndex = rNONE;
  local_50.ptrMult = 0;
  local_50.ptrNum = 0;
  CodeGenGenericContext::MemWrite(ctx,&local_70,&local_50);
  op = (x86Command)local_80;
LAB_001d1d7b:
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argPtr;
  (pxVar1->argA).field_1.ptrSize = size;
  pxVar1 = ctx->x86Op;
  (pxVar1->argA).ptrIndex = xVar3;
  (pxVar1->argA).ptrMult = local_78;
  (pxVar1->argA).ptrBase = xVar2;
  (pxVar1->argA).ptrNum = local_74;
  (pxVar1->argB).type = argReg;
  (pxVar1->argB).field_1.reg = (x86Reg)uVar5;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_RPTR_REG(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, x86Reg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	ctx.RedirectAddressComputation(index, multiplier, base, shift);

	x86Reg redirect = ctx.RedirectRegister(reg2);

	// On x86 it is impossible to move extra registers into a byte of memory, so some redirections are ignored
	if(sizeof(void*) == 4 && size == sBYTE)
	{
		if(redirect <= rEDX)
			reg2 = redirect;
	}
	else
	{
		reg2 = redirect;
	}

	if(size == sDWORD && ctx.genReg[reg2].type == x86Argument::argNumber)
	{
		EMIT_OP_RPTR_NUM(ctx, op, size, index, multiplier, base, shift, ctx.genReg[reg2].num);
		return;
	}

	// Register reads
	ctx.ReadRegister(base);
	ctx.ReadRegister(index);
	ctx.ReadRegister(reg2);

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_mov:
	case o_mov64:
		assert(base != rESP);

		ctx.InvalidateAddressValue(arg);

		ctx.MemKillDeadStore(arg);

		// Track target memory value
		ctx.MemWrite(arg, x86Argument(reg2));
		break;
	case o_add:
	case o_sub:
	case o_adc:
	case o_sbb:
	case o_and:
	case o_or:
	case o_xor:
	case o_add64:
	case o_sub64:
	case o_and64:
	case o_or64:
	case o_xor64:
		ctx.MemRead(arg);

		ctx.InvalidateAddressValue(arg);
		
		ctx.MemWrite(arg, x86Argument());
		break;
	case o_cmp:
	case o_cmp64:
		ctx.MemRead(arg);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argReg;
	ctx.x86Op->argB.reg = reg2;
	ctx.x86Op++;
}